

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O0

Lazy<std::pair<std::error_code,_unsigned_long>_> __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::async_write
          (basic_seq_coro_file<(coro_io::execution_type)1> *this,string_view buf)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 in_RCX;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  size_t in_RDX;
  undefined8 in_RSI;
  LazyBase<std::pair<std::error_code,_unsigned_long>,_false> in_RDI;
  basic_seq_coro_file<(coro_io::execution_type)1> *in_stack_00000008;
  span<char,_18446744073709551615UL> in_stack_00000010;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  span<char,_18446744073709551615UL> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  int iVar3;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  
  puVar2 = (undefined8 *)operator_new(0xb0,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = async_write;
    puVar2[1] = async_write;
    this_00 = (basic_string_view<char,_std::char_traits<char>_> *)(puVar2 + 0xc);
    puVar2[0x14] = in_RSI;
    this_00->_M_len = in_RDX;
    puVar2[0xd] = in_RCX;
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::LazyPromise
              ((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
    get_return_object((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)
                      CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0xad));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0xad));
      std::basic_string_view<char,_std::char_traits<char>_>::data(this_00);
      std::basic_string_view<char,_std::char_traits<char>_>::size(this_00);
      std::span<char,_18446744073709551615UL>::span<char_*>
                (in_stack_fffffffffffffe60,
                 (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      async_read_write<false>(in_stack_00000008,in_stack_00000010);
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      bVar1 = async_simple::coro::detail::
              LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                        ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                         (puVar2 + 0x11));
      if (bVar1) {
        puVar2[0x10] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                       (puVar2 + 0x11);
        async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
        awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                    CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
        async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
        return_value<std::pair<std::error_code,_unsigned_long>_>
                  ((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   (pair<std::error_code,_unsigned_long> *)
                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        iVar3 = 0;
        async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
        ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x178318);
        async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                  ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x178325);
        if (iVar3 == 0) {
          async_simple::coro::detail::LazyPromiseBase::final_suspend
                    ((LazyPromiseBase *)(puVar2 + 2));
          bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                            ((FinalAwaiter *)((long)puVar2 + 0xae));
          if (!bVar1) {
            *puVar2 = 0;
            *(undefined1 *)((long)puVar2 + 0xac) = 2;
            coro_io::basic_seq_coro_file
                      (in_stack_fffffffffffffe60,
                       (void *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
            (*(code *)*extraout_RAX_00)(extraout_RAX_00);
            return (Lazy<std::pair<std::error_code,_unsigned_long>_>)
                   in_RDI._coro.__handle_.__handle_;
          }
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0xae));
        }
        async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
        ~LazyPromise((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)0x178499);
        if (puVar2 != (undefined8 *)0x0) {
          operator_delete(puVar2,0xb0);
        }
      }
      else {
        *(undefined1 *)((long)puVar2 + 0xac) = 1;
        coro_io::basic_seq_coro_file
                  ((void *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (void *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)((long)puVar2 + 0xac) = 0;
      coro_io::basic_seq_coro_file
                (in_stack_fffffffffffffe60,
                 (void *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
  }
  return (Lazy<std::pair<std::error_code,_unsigned_long>_>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<std::pair<std::error_code, size_t>> async_write(
      std::string_view buf) {
    if constexpr (execute_type == execution_type::thread_pool) {
      co_return co_await async_read_write<false>(
          std::span(const_cast<char *>(buf.data()), buf.size()));
    }
    else {
#if defined(ENABLE_FILE_IO_URING) || defined(ASIO_WINDOWS)
      if (async_seq_file_ == nullptr) {
        co_return std::make_pair(
            std::make_error_code(std::errc::invalid_argument), 0);
      }
      auto [ec, size] =
          co_await coro_io::async_write(*async_seq_file_, asio::buffer(buf));
      co_return std::make_pair(ec, size);
#else
      co_return co_await async_read_write<false>(
          std::span(const_cast<char *>(buf.data()), buf.size()));
#endif
    }
  }